

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_generic_section.cpp
# Opt level: O0

void __thiscall
GenericSection_RoundTripForPopulated_Test::TestBody(GenericSection_RoundTripForPopulated_Test *this)

{
  bool bVar1;
  uint generation;
  iterator first;
  iterator last;
  mapped_type *pmVar2;
  string *src;
  parser<pstore::exchange::import_ns::callbacks> *ppVar3;
  Message *pMVar4;
  error_code *peVar5;
  char *pcVar6;
  reference this_00;
  pointer this_01;
  section_kind *lhs;
  small_vector<unsigned_char,_128UL> *rhs;
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<pstore::small_vector<unsigned_char,_128UL>_>_>
  *matcher;
  vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_> *rhs_00;
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>_>_>
  *matcher_00;
  database *this_02;
  long *__args_4;
  pointer *args_2;
  insert_iterator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>_>
  out;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffff4ec;
  AssertHelper local_990;
  Message local_988;
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>_>_>
  local_980;
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>_>_>_>
  local_968;
  undefined1 local_950 [8];
  AssertionResult gtest_ar_5;
  Message local_938;
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<pstore::small_vector<unsigned_char,_128UL>_>_>
  local_930;
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<pstore::small_vector<unsigned_char,_128UL>_>_>_>
  local_888;
  undefined1 local_7e0 [8];
  AssertionResult gtest_ar_4;
  Message local_7c8;
  undefined1 local_7c0 [8];
  AssertionResult gtest_ar_3;
  Message local_7a8;
  undefined1 local_7a0 [8];
  AssertionResult gtest_ar_2;
  Message local_788;
  undefined1 local_780 [8];
  AssertionResult gtest_ar_1;
  Message local_768;
  uint local_75c;
  size_type local_758;
  undefined1 local_750 [8];
  AssertionResult gtest_ar;
  AssertHelper local_720;
  string local_718;
  Message local_6f8;
  bool local_6e9;
  undefined1 local_6e8 [8];
  AssertionResult gtest_ar__1;
  parser<pstore::exchange::import_ns::callbacks> parser;
  section_content imported_content;
  back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
  inserter;
  vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  dispatchers;
  string local_528;
  AssertHelper local_508;
  char local_4f9;
  string local_4f8;
  Message local_4d8;
  bool local_4c9;
  undefined1 local_4c8 [8];
  AssertionResult gtest_ar_;
  callbacks local_4b0;
  undefined1 local_4a0 [8];
  parser<pstore::exchange::import_ns::callbacks> parser_1;
  undefined1 local_3e8 [8];
  transaction<std::unique_lock<mock_mutex>_> transaction;
  undefined1 local_3a8 [7];
  mock_mutex mutex;
  string_mapping imported_names;
  string exported_json;
  unsigned_long local_300;
  binding local_2f8;
  uchar local_2f2;
  allocator local_2f1;
  key_type local_2f0;
  long local_2d0 [2];
  binding local_2c0;
  uchar local_2ba;
  allocator local_2b9;
  key_type local_2b8;
  long local_298 [2];
  uchar local_282;
  section_kind local_281;
  long local_280 [2];
  uchar local_26a;
  section_kind local_269;
  small_vector<unsigned_char,_128UL> *local_268;
  uint *local_260;
  small_vector<unsigned_char,_128UL> *local_258;
  undefined4 local_24c;
  undefined1 local_248 [4];
  uint value;
  section_content exported_content;
  string local_160;
  indent local_13c;
  undefined1 local_138 [8];
  ostringstream exported_names_stream;
  undefined1 local_e0 [8];
  string_mapping exported_names;
  undefined1 local_80 [8];
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>
  indir_strings;
  array<const_char_*,_2UL> names;
  char *name2;
  char *name1;
  bool comments;
  indices names_index;
  section_kind kind;
  GenericSection_RoundTripForPopulated_Test *this_local;
  
  comments = false;
  indir_strings._M_h._M_single_bucket = (__node_base_ptr)anon_var_dwarf_a4892;
  _names_index = this;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>
                   *)local_80);
  first = std::begin<std::array<char_const*,2ul>>
                    ((array<const_char_*,_2UL> *)&indir_strings._M_h._M_single_bucket);
  last = std::end<std::array<char_const*,2ul>>
                   ((array<const_char_*,_2UL> *)&indir_strings._M_h._M_single_bucket);
  exported_names.strings_._M_h._M_single_bucket =
       (__node_base_ptr)
       std::
       end<std::unordered_map<std::__cxx11::string,pstore::typed_address<pstore::indirect_string>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,pstore::typed_address<pstore::indirect_string>>>>>
                 ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>
                   *)local_80);
  out = std::
        inserter<std::unordered_map<std::__cxx11::string,pstore::typed_address<pstore::indirect_string>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,pstore::typed_address<pstore::indirect_string>>>>>
                  ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>
                    *)local_80,(iterator)exported_names.strings_._M_h._M_single_bucket);
  add_export_strings<(pstore::trailer::indices)3,char_const**,std::insert_iterator<std::unordered_map<std::__cxx11::string,pstore::typed_address<pstore::indirect_string>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,pstore::typed_address<pstore::indirect_string>>>>>>
            (&(this->super_GenericSection).export_db_,first,last,out);
  pstore::exchange::export_ns::name_index_tag();
  pstore::exchange::export_ns::string_mapping::string_mapping<(pstore::trailer::indices)3>
            ((string_mapping *)local_e0,&(this->super_GenericSection).export_db_);
  pstore::exchange::export_ns::ostringstream::ostringstream((ostringstream *)local_138);
  local_13c.distance_ = 0;
  pstore::exchange::export_ns::indent::indent(&local_13c);
  this_02 = &(this->super_GenericSection).export_db_;
  generation = pstore::database::get_current_revision(this_02);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_160,"",
             (allocator *)
             ((long)&exported_content.xfixups.
                     super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  uVar7 = 0;
  pstore::exchange::export_ns::emit_strings<(pstore::trailer::indices)3>
            ((ostream_base *)local_138,local_13c,this_02,generation,&local_160,
             (string_mapping *)local_e0,false);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&exported_content.xfixups.
                     super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pstore::repo::section_content::section_content((section_content *)local_248);
  local_248[1] = ' ';
  local_24c = 0;
  local_258 = (small_vector<unsigned_char,_128UL> *)
              std::back_inserter<pstore::small_vector<unsigned_char,128ul>>
                        ((small_vector<unsigned_char,_128UL> *)&exported_content);
  local_260 = &local_24c;
  local_268 = (small_vector<unsigned_char,_128UL> *)
              std::
              generate_n<std::back_insert_iterator<pstore::small_vector<unsigned_char,128ul>>,unsigned_int,GenericSection_RoundTripForPopulated_Test::TestBody()::__0>
                        ((back_insert_iterator<pstore::small_vector<unsigned_char,_128UL>_>)
                         local_258,5,(anon_class_8_1_a8c68091)local_260);
  local_269 = data;
  local_26a = '\x03';
  local_280[1] = 5;
  local_280[0] = 7;
  std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>::
  emplace_back<pstore::repo::section_kind,unsigned_char,unsigned_long,long>
            ((vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>> *)
             &exported_content.data.buffer_,&local_269,&local_26a,(unsigned_long *)(local_280 + 1),
             local_280);
  local_281 = read_only;
  local_282 = '\v';
  local_298[1] = 0xd;
  local_298[0] = 0x11;
  std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>::
  emplace_back<pstore::repo::section_kind,unsigned_char,unsigned_long,long>
            ((vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>> *)
             &exported_content.data.buffer_,&local_281,&local_282,(unsigned_long *)(local_298 + 1),
             local_298);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2b8,"name1",&local_2b9);
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>
           ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>
                         *)local_80,&local_2b8);
  local_2ba = '\x13';
  local_2c0 = strong;
  local_2d0[1] = 0x17;
  local_2d0[0] = 0x1d;
  std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>::
  emplace_back<pstore::typed_address<pstore::indirect_string>&,unsigned_char,pstore::repo::binding,unsigned_long,long>
            ((vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>> *)
             &exported_content.ifixups.
              super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,pmVar2,&local_2ba,&local_2c0,
             (unsigned_long *)(local_2d0 + 1),local_2d0);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2f0,"name2",&local_2f1);
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>
           ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>
                         *)local_80,&local_2f0);
  local_2f2 = '\x1f';
  local_2f8 = weak;
  local_300 = 0x25;
  exported_json.field_2._8_8_ = 0x29;
  __args_4 = (long *)(exported_json.field_2._M_local_buf + 8);
  std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>::
  emplace_back<pstore::typed_address<pstore::indirect_string>&,unsigned_char,pstore::repo::binding,unsigned_long,long>
            ((vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>> *)
             &exported_content.ifixups.
              super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,pmVar2,&local_2f2,&local_2f8,
             &local_300,__args_4);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
  export_section<(pstore::repo::section_kind)0>
            ((string *)&imported_names.lookup_._M_h._M_single_bucket,
             &(this->super_GenericSection).export_db_,(string_mapping *)local_e0,
             (section_content *)local_248,false);
  pstore::exchange::import_ns::string_mapping::string_mapping((string_mapping *)local_3a8);
  std::unique_lock<mock_mutex>::unique_lock
            ((unique_lock<mock_mutex> *)&parser_1.coordinate_,
             (mutex_type *)&transaction.lock_.field_0xf);
  ::begin((transaction<std::unique_lock<mock_mutex>_> *)local_3e8,
          &(this->super_GenericSection).import_db_,(unique_lock<mock_mutex> *)&parser_1.coordinate_)
  ;
  std::unique_lock<mock_mutex>::~unique_lock((unique_lock<mock_mutex> *)&parser_1.coordinate_);
  pstore::gsl::not_null<pstore::database_*>::not_null
            ((not_null<pstore::database_*> *)&gtest_ar_.message_,
             &(this->super_GenericSection).import_db_);
  pstore::exchange::import_ns::callbacks::
  make<pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::strings_array_members,pstore::transaction<std::unique_lock<mock_mutex>>*,pstore::exchange::import_ns::string_mapping*>,pstore::transaction<std::unique_lock<mock_mutex>>*,pstore::exchange::import_ns::string_mapping*>
            (&local_4b0,
             (not_null<pstore::database_*>)
             gtest_ar_.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,(transaction<std::unique_lock<mock_mutex>_> *)local_3e8,
             (string_mapping *)local_3a8);
  pstore::json::make_parser<pstore::exchange::import_ns::callbacks>
            ((parser<pstore::exchange::import_ns::callbacks> *)local_4a0,&local_4b0,none);
  pstore::exchange::import_ns::callbacks::~callbacks(&local_4b0);
  src = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_((ostringstream *)local_138);
  ppVar3 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::input
                     ((parser<pstore::exchange::import_ns::callbacks> *)local_4a0,src);
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::eof(ppVar3);
  local_4c9 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::has_error
                        ((parser<pstore::exchange::import_ns::callbacks> *)local_4a0);
  local_4c9 = !local_4c9;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4c8,&local_4c9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4c8);
  if (!bVar1) {
    testing::Message::Message(&local_4d8);
    pMVar4 = testing::Message::operator<<
                       (&local_4d8,(char (*) [37])"Expected the JSON parse to succeed (");
    peVar5 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::last_error
                       ((parser<pstore::exchange::import_ns::callbacks> *)local_4a0);
    std::error_code::message_abi_cxx11_(&local_4f8,peVar5);
    pMVar4 = testing::Message::operator<<(pMVar4,&local_4f8);
    local_4f9 = ')';
    pMVar4 = testing::Message::operator<<(pMVar4,&local_4f9);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_528,(internal *)local_4c8,(AssertionResult *)0x2ecd1e,"true","false",
               (char *)__args_4);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_508,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_generic_section.cpp"
               ,0xb2,pcVar6);
    testing::internal::AssertHelper::operator=(&local_508,pMVar4);
    testing::internal::AssertHelper::~AssertHelper(&local_508);
    std::__cxx11::string::~string((string *)&local_528);
    std::__cxx11::string::~string((string *)&local_4f8);
    testing::Message::~Message(&local_4d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c8);
  if (bVar1) {
    pstore::transaction_base::commit((transaction_base *)local_3e8);
  }
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::~parser
            ((parser<pstore::exchange::import_ns::callbacks> *)local_4a0);
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)local_3e8);
  if (bVar1) {
    std::
    vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
    ::vector((vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
              *)&inserter);
    imported_content.xfixups.
    super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  back_inserter<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>
                            ((vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
                              *)&inserter);
    pstore::repo::section_content::section_content((section_content *)&parser.coordinate_);
    args_2 = &imported_content.xfixups.
              super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (anonymous_namespace)::
    make_json_object_parser<pstore::exchange::import_ns::generic_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>>,pstore::repo::section_kind,pstore::exchange::import_ns::string_mapping*,pstore::repo::section_content*,std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>*>
              ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar__1.message_,
               (_anonymous_namespace_ *)&(this->super_GenericSection).import_db_,(database *)0x0,
               (section_kind)local_3a8,(string_mapping *)&parser.coordinate_,
               (section_content *)args_2,
               (back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
                *)CONCAT44(in_stack_fffffffffffff4ec,uVar7));
    ppVar3 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::input
                       ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar__1.message_,
                        (string *)&imported_names.lookup_._M_h._M_single_bucket);
    pstore::json::parser<pstore::exchange::import_ns::callbacks>::eof(ppVar3);
    local_6e9 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::has_error
                          ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar__1.message_);
    local_6e9 = !local_6e9;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_6e8,&local_6e9,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6e8);
    if (!bVar1) {
      testing::Message::Message(&local_6f8);
      pMVar4 = testing::Message::operator<<(&local_6f8,(char (*) [17])"JSON error was: ");
      peVar5 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::last_error
                         ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar__1.message_);
      std::error_code::message_abi_cxx11_(&local_718,peVar5);
      pMVar4 = testing::Message::operator<<(pMVar4,&local_718);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar.message_,(internal *)local_6e8,(AssertionResult *)0x2ecd1e,
                 "true","false",(char *)args_2);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_720,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_generic_section.cpp"
                 ,0xc5,pcVar6);
      testing::internal::AssertHelper::operator=(&local_720,pMVar4);
      testing::internal::AssertHelper::~AssertHelper(&local_720);
      std::__cxx11::string::~string((string *)&gtest_ar.message_);
      std::__cxx11::string::~string((string *)&local_718);
      testing::Message::~Message(&local_6f8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_6e8);
    if (bVar1) {
      local_758 = std::
                  vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
                  ::size((vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
                          *)&inserter);
      local_75c = 1;
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
                ((EqHelper *)local_750,"dispatchers.size ()","1U",&local_758,&local_75c);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_750);
      if (!bVar1) {
        testing::Message::Message(&local_768);
        pMVar4 = testing::Message::operator<<
                           (&local_768,
                            (char (*) [79])
                            "Expected a single creation dispatcher to be added to the dispatchers container"
                           );
        pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_750);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_1.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_generic_section.cpp"
                   ,199,pcVar6);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,pMVar4);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
        testing::Message::~Message(&local_768);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_750);
      if (bVar1) {
        this_00 = std::
                  vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
                  ::front((vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
                           *)&inserter);
        this_01 = std::
                  unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
                  ::operator->(this_00);
        lhs = pstore::repo::section_creation_dispatcher::kind(this_01);
        testing::internal::EqHelper::
        Compare<pstore::repo::section_kind,_pstore::repo::section_kind,_nullptr>
                  ((EqHelper *)local_780,"dispatchers.front ()->kind ()","kind",lhs,&comments);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_780);
        if (!bVar1) {
          testing::Message::Message(&local_788);
          pMVar4 = testing::Message::operator<<
                             (&local_788,
                              (char (*) [64])
                              "The creation dispatcher should be able to create a text section");
          pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_780);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_generic_section.cpp"
                     ,0xc9,pcVar6);
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,pMVar4);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
          testing::Message::~Message(&local_788);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_780);
        testing::internal::EqHelper::
        Compare<pstore::repo::section_kind,_pstore::repo::section_kind,_nullptr>
                  ((EqHelper *)local_7a0,"exported_content.kind","imported_content.kind",local_248,
                   (section_kind *)&parser.coordinate_);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7a0);
        if (!bVar1) {
          testing::Message::Message(&local_7a8);
          pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_7a0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_generic_section.cpp"
                     ,0xcc,pcVar6);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_3.message_,&local_7a8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
          testing::Message::~Message(&local_7a8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_7a0);
        testing::internal::EqHelper::Compare<unsigned_char,_unsigned_char,_nullptr>
                  ((EqHelper *)local_7c0,"exported_content.align","imported_content.align",
                   local_248 + 1,(uchar *)((long)&parser.coordinate_.column + 1));
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7c0);
        if (!bVar1) {
          testing::Message::Message(&local_7c8);
          pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_7c0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_generic_section.cpp"
                     ,0xcd,pcVar6);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_4.message_,&local_7c8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
          testing::Message::~Message(&local_7c8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_7c0);
        testing::ContainerEq<pstore::small_vector<unsigned_char,128ul>>
                  (&local_930,(testing *)&imported_content,rhs);
        testing::internal::
        MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<pstore::small_vector<unsigned_char,128ul>>>>
                  (&local_888,(internal *)&local_930,matcher);
        testing::internal::
        PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<pstore::small_vector<unsigned_char,128ul>>>>
        ::operator()(local_7e0,(char *)&local_888,
                     (small_vector<unsigned_char,_128UL> *)"exported_content.data");
        testing::internal::
        PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<pstore::small_vector<unsigned_char,_128UL>_>_>_>
        ::~PredicateFormatterFromMatcher(&local_888);
        testing::
        PolymorphicMatcher<testing::internal::ContainerEqMatcher<pstore::small_vector<unsigned_char,_128UL>_>_>
        ::~PolymorphicMatcher(&local_930);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7e0);
        if (!bVar1) {
          testing::Message::Message(&local_938);
          pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_7e0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_generic_section.cpp"
                     ,0xce,pcVar6);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_5.message_,&local_938);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
          testing::Message::~Message(&local_938);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_7e0);
        testing::
        ContainerEq<std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>
                  (&local_980,(testing *)&imported_content.data.buffer_,rhs_00);
        testing::internal::
        MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>>>
                  (&local_968,(internal *)&local_980,matcher_00);
        testing::internal::
        PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>>>
        ::operator()(local_950,(char *)&local_968,
                     (vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                      *)"exported_content.ifixups");
        testing::internal::
        PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>_>_>_>
        ::~PredicateFormatterFromMatcher(&local_968);
        testing::
        PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>_>_>
        ::~PolymorphicMatcher(&local_980);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_950);
        if (!bVar1) {
          testing::Message::Message(&local_988);
          pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_950);
          testing::internal::AssertHelper::AssertHelper
                    (&local_990,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_generic_section.cpp"
                     ,0xcf,pcVar6);
          testing::internal::AssertHelper::operator=(&local_990,&local_988);
          testing::internal::AssertHelper::~AssertHelper(&local_990);
          testing::Message::~Message(&local_988);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_950);
        compare_external_fixups<std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>,std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>
                  (&(this->super_GenericSection).export_db_,
                   (vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                    *)&exported_content.ifixups.
                       super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   &(this->super_GenericSection).import_db_,
                   (vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                    *)&imported_content.ifixups.
                       super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
    }
    pstore::json::parser<pstore::exchange::import_ns::callbacks>::~parser
              ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar__1.message_);
    pstore::repo::section_content::~section_content((section_content *)&parser.coordinate_);
    std::
    vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
    ::~vector((vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
               *)&inserter);
  }
  pstore::exchange::import_ns::string_mapping::~string_mapping((string_mapping *)local_3a8);
  std::__cxx11::string::~string((string *)&imported_names.lookup_._M_h._M_single_bucket);
  pstore::repo::section_content::~section_content((section_content *)local_248);
  pstore::exchange::export_ns::ostringstream::~ostringstream((ostringstream *)local_138);
  pstore::exchange::export_ns::string_mapping::~string_mapping((string_mapping *)local_e0);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>
                    *)local_80);
  return;
}

Assistant:

TEST_F (GenericSection, RoundTripForPopulated) {
    using namespace pstore::exchange;

    constexpr auto kind = pstore::repo::section_kind::text;
    constexpr auto names_index = pstore::trailer::indices::name;
    constexpr auto comments = false;

    // The type used to store a text section's properties.
    using section_type = pstore::repo::enum_to_section_t<kind>;
    static_assert (std::is_same<section_type, pstore::repo::generic_section>::value,
                   "Expected text to map to generic_section");

    // Add names to the store so that external fixups can use then. add_export_strings()
    // yields a mapping from each name to its indirect-address.
    constexpr auto * name1 = "name1";
    constexpr auto * name2 = "name2";
    std::array<pstore::gsl::czstring, 2> names{{name1, name2}};
    std::unordered_map<std::string, pstore::typed_address<pstore::indirect_string>> indir_strings;
    add_export_strings<names_index> (export_db_, std::begin (names), std::end (names),
                                     std::inserter (indir_strings, std::end (indir_strings)));

    // Write the names that we just created as JSON.
    export_ns::string_mapping exported_names{export_db_, export_ns::name_index_tag ()};
    export_ns::ostringstream exported_names_stream;
    export_ns::emit_strings<names_index> (exported_names_stream, export_ns::indent{}, export_db_,
                                          export_db_.get_current_revision (), "", &exported_names,
                                          comments);


    pstore::repo::section_content exported_content;
    exported_content.align = 32U;
    {
        unsigned value = 0;
        std::generate_n (std::back_inserter (exported_content.data), 5U, [&value] () {
            return static_cast<decltype (exported_content.data)::value_type> (value++);
        });
    }
    exported_content.ifixups.emplace_back (pstore::repo::section_kind::data,
                                           pstore::repo::relocation_type{3},
                                           std::uint64_t{5} /*offset*/, std::int64_t{7} /*addend*/);
    exported_content.ifixups.emplace_back (
        pstore::repo::section_kind::read_only, pstore::repo::relocation_type{11},
        std::uint64_t{13} /*offset*/, std::int64_t{17} /*addend*/);
    exported_content.xfixups.emplace_back (
        indir_strings[name1], pstore::repo::relocation_type{19}, pstore::repo::binding::strong,
        std::uint64_t{23} /*offset*/, std::int64_t{29} /*addend*/);
    exported_content.xfixups.emplace_back (
        indir_strings[name2], pstore::repo::relocation_type{31}, pstore::repo::binding::weak,
        std::uint64_t{37} /*offset*/, std::int64_t{41} /*addend*/);


    std::string const exported_json =
        export_section<kind> (export_db_, exported_names, exported_content, comments);



    // Parse the exported names JSON. The resulting index-to-string mappings are then available via
    // imported_names.
    import_ns::string_mapping imported_names;
    {
        // Create matching names in the imported database.
        mock_mutex mutex;
        using transaction_lock = std::unique_lock<mock_mutex>;
        auto transaction = begin (import_db_, transaction_lock{mutex});

        auto parser = pstore::json::make_parser (
            import_ns::callbacks::make<
                import_ns::array_rule<import_ns::strings_array_members, decltype (&transaction),
                                      decltype (&imported_names)>> (&import_db_, &transaction,
                                                                    &imported_names));
        parser.input (exported_names_stream.str ()).eof ();
        ASSERT_FALSE (parser.has_error ())
            << "Expected the JSON parse to succeed (" << parser.last_error ().message () << ')';

        transaction.commit ();
    }

    // Now set up the import. We'll build two objects: an instance of a section-creation-dispatcher
    // which knows how to build a text section and a section-content which will describe the
    // contents of that new section.
    std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher>> dispatchers;
    auto inserter = std::back_inserter (dispatchers);

    pstore::repo::section_content imported_content;

    // Find the rule that is used to import sections represented by an instance of section_type.
    using section_importer = import_ns::section_to_importer_t<section_type, decltype (inserter)>;
    auto parser = make_json_object_parser<section_importer> (&import_db_, kind, &imported_names,
                                                             &imported_content, &inserter);
    parser.input (exported_json).eof ();
    ASSERT_FALSE (parser.has_error ()) << "JSON error was: " << parser.last_error ().message ();

    ASSERT_EQ (dispatchers.size (), 1U)
        << "Expected a single creation dispatcher to be added to the dispatchers container";
    EXPECT_EQ (dispatchers.front ()->kind (), kind)
        << "The creation dispatcher should be able to create a text section";

    EXPECT_EQ (exported_content.kind, imported_content.kind);
    EXPECT_EQ (exported_content.align, imported_content.align);
    EXPECT_THAT (exported_content.data, testing::ContainerEq (imported_content.data));
    EXPECT_THAT (exported_content.ifixups, testing::ContainerEq (imported_content.ifixups));
    compare_external_fixups (export_db_, exported_content.xfixups, import_db_,
                             imported_content.xfixups);
}